

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void sve_ld4_r(CPUARMState_conflict *env,void *vg,target_ulong addr,uint32_t desc,int size,
              uintptr_t ra,sve_ld1_tlb_fn *tlb_fn)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ushort local_44a;
  undefined1 local_448 [6];
  uint16_t pg;
  ARMVectorReg_conflict scratch [4];
  intptr_t oprsz;
  intptr_t i;
  uint rd;
  TCGMemOpIdx oi;
  uintptr_t ra_local;
  int size_local;
  uint32_t desc_local;
  target_ulong addr_local;
  void *vg_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = extract32(desc,10,8);
  uVar2 = extract32(desc,0x12,5);
  scratch[3].d[0x1f] = simd_oprsz(desc);
  memset(local_448,0,0x400);
  set_helper_retaddr(ra);
  oprsz = 0;
  _size_local = addr;
  while (oprsz < (long)scratch[3].d[0x1f]) {
    local_44a = *(ushort *)((long)vg + (oprsz >> 3));
    do {
      if ((local_44a & 1) != 0) {
        (*tlb_fn)(env,local_448,oprsz,_size_local,uVar1,ra);
        (*tlb_fn)(env,scratch[0].d + 0x1f,oprsz,_size_local + (long)size,uVar1,ra);
        (*tlb_fn)(env,scratch[1].d + 0x1f,oprsz,_size_local + (long)(size << 1),uVar1,ra);
        (*tlb_fn)(env,scratch[2].d + 0x1f,oprsz,_size_local + (long)(size * 3),uVar1,ra);
      }
      oprsz = size + oprsz;
      local_44a = (ushort)((int)(uint)local_44a >> ((byte)size & 0x1f));
      _size_local = (long)(size << 2) + _size_local;
    } while ((oprsz & 0xfU) != 0);
  }
  clear_helper_retaddr();
  memcpy((env->vfp).zregs + uVar2,local_448,scratch[3].d[0x1f]);
  memcpy((env->vfp).zregs + (uVar2 + 1 & 0x1f),scratch[0].d + 0x1f,scratch[3].d[0x1f]);
  memcpy((env->vfp).zregs + (uVar2 + 2 & 0x1f),scratch[1].d + 0x1f,scratch[3].d[0x1f]);
  memcpy((env->vfp).zregs + (uVar2 + 3 & 0x1f),scratch[2].d + 0x1f,scratch[3].d[0x1f]);
  return;
}

Assistant:

static void sve_ld4_r(CPUARMState *env, void *vg, target_ulong addr,
                      uint32_t desc, int size, uintptr_t ra,
                      sve_ld1_tlb_fn *tlb_fn)
{
    const TCGMemOpIdx oi = extract32(desc, SIMD_DATA_SHIFT, MEMOPIDX_SHIFT);
    const unsigned rd = extract32(desc, SIMD_DATA_SHIFT + MEMOPIDX_SHIFT, 5);
    intptr_t i, oprsz = simd_oprsz(desc);
    ARMVectorReg scratch[4] = { 0 };

    set_helper_retaddr(ra);
    for (i = 0; i < oprsz; ) {
        uint16_t pg = *(uint16_t *)((char *)vg + H1_2(i >> 3));
        do {
            if (pg & 1) {
                tlb_fn(env, &scratch[0], i, addr, oi, ra);
                tlb_fn(env, &scratch[1], i, addr + size, oi, ra);
                tlb_fn(env, &scratch[2], i, addr + 2 * size, oi, ra);
                tlb_fn(env, &scratch[3], i, addr + 3 * size, oi, ra);
            }
            i += size, pg >>= size;
            addr += 4 * size;
        } while (i & 15);
    }
    clear_helper_retaddr();

    /* Wait until all exceptions have been raised to write back.  */
    memcpy(&env->vfp.zregs[rd], &scratch[0], oprsz);
    memcpy(&env->vfp.zregs[(rd + 1) & 31], &scratch[1], oprsz);
    memcpy(&env->vfp.zregs[(rd + 2) & 31], &scratch[2], oprsz);
    memcpy(&env->vfp.zregs[(rd + 3) & 31], &scratch[3], oprsz);
}